

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void kj::printStackTraceOnCrash(void)

{
  int iVar1;
  void *pvVar2;
  Fault local_188;
  Fault f_7;
  SyscallResult local_174;
  SyscallResult _kjSyscallResult_7;
  Fault f_6;
  SyscallResult local_15c;
  SyscallResult _kjSyscallResult_6;
  Fault f_5;
  SyscallResult local_144;
  SyscallResult _kjSyscallResult_5;
  Fault f_4;
  SyscallResult local_12c;
  SyscallResult _kjSyscallResult_4;
  Fault f_3;
  SyscallResult local_114;
  SyscallResult _kjSyscallResult_3;
  Fault f_2;
  SyscallResult local_fc;
  SyscallResult _kjSyscallResult_2;
  Fault f_1;
  SyscallResult local_e4;
  undefined1 auStack_e0 [4];
  SyscallResult _kjSyscallResult_1;
  sigaction action;
  Fault local_38;
  Fault f;
  SyscallResult local_24;
  undefined1 auStack_20 [4];
  SyscallResult _kjSyscallResult;
  stack_t stack;
  
  memset(auStack_20,0,0x18);
  _auStack_20 = (char *)mmap((void *)0x0,0x10000,3,0x122,-1,0);
  f.exception = (Exception *)auStack_20;
  local_24 = _::Debug::syscall<kj::printStackTraceOnCrash()::__0>
                       ((anon_class_8_1_a8a4b1a8 *)&f,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_24);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_24);
    _::Debug::Fault::Fault
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x1f6,iVar1,"sigaltstack(&stack, nullptr)","");
    _::Debug::Fault::fatal(&local_38);
  }
  memset(auStack_e0,0,0x98);
  _auStack_e0 = anon_unknown_52::crashHandler;
  f_1.exception = (Exception *)auStack_e0;
  local_e4 = _::Debug::syscall<kj::printStackTraceOnCrash()::__1>
                       ((anon_class_8_1_4c536f74 *)&f_1,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_e4);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_e4);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xffffffffffffff08,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x200,iVar1,"sigaction(SIGSEGV, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff08);
  }
  f_2.exception = (Exception *)auStack_e0;
  local_fc = _::Debug::syscall<kj::printStackTraceOnCrash()::__2>
                       ((anon_class_8_1_4c536f74 *)&f_2,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_fc);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_fc);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffef0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x201,iVar1,"sigaction(SIGBUS, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffef0);
  }
  f_3.exception = (Exception *)auStack_e0;
  local_114 = _::Debug::syscall<kj::printStackTraceOnCrash()::__3>
                        ((anon_class_8_1_4c536f74 *)&f_3,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_114);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_114);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffed8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x202,iVar1,"sigaction(SIGFPE, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffed8);
  }
  f_4.exception = (Exception *)auStack_e0;
  local_12c = _::Debug::syscall<kj::printStackTraceOnCrash()::__4>
                        ((anon_class_8_1_4c536f74 *)&f_4,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_12c);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_12c);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffec0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x203,iVar1,"sigaction(SIGABRT, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffec0);
  }
  f_5.exception = (Exception *)auStack_e0;
  local_144 = _::Debug::syscall<kj::printStackTraceOnCrash()::__5>
                        ((anon_class_8_1_4c536f74 *)&f_5,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_144);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_144);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffea8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x204,iVar1,"sigaction(SIGILL, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffea8);
  }
  f_6.exception = (Exception *)auStack_e0;
  local_15c = _::Debug::syscall<kj::printStackTraceOnCrash()::__6>
                        ((anon_class_8_1_4c536f74 *)&f_6,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_15c);
  if (pvVar2 == (void *)0x0) {
    iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_15c);
    _::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffe90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
               ,0x207,iVar1,"sigaction(SIGSYS, &action, nullptr)","");
    _::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe90);
  }
  f_7.exception = (Exception *)auStack_e0;
  local_174 = _::Debug::syscall<kj::printStackTraceOnCrash()::__7>
                        ((anon_class_8_1_4c536f74 *)&f_7,false);
  pvVar2 = _::Debug::SyscallResult::operator_cast_to_void_(&local_174);
  if (pvVar2 != (void *)0x0) {
    return;
  }
  iVar1 = _::Debug::SyscallResult::getErrorNumber(&local_174);
  _::Debug::Fault::Fault
            (&local_188,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/exception.c++"
             ,0x20c,iVar1,"sigaction(SIGINT, &action, nullptr)","");
  _::Debug::Fault::fatal(&local_188);
}

Assistant:

void printStackTraceOnCrash() {
  // Set up alternate signal stack so that stack overflows can be handled.
  stack_t stack;
  memset(&stack, 0, sizeof(stack));

#ifndef MAP_ANONYMOUS
#define MAP_ANONYMOUS MAP_ANON
#endif
#ifndef MAP_GROWSDOWN
#define MAP_GROWSDOWN 0
#endif

  stack.ss_size = 65536;
  // Note: ss_sp is char* on FreeBSD, void* on Linux and OSX.
  stack.ss_sp = reinterpret_cast<char*>(mmap(
      nullptr, stack.ss_size, PROT_READ | PROT_WRITE,
      MAP_ANONYMOUS | MAP_PRIVATE | MAP_GROWSDOWN, -1, 0));
  KJ_SYSCALL(sigaltstack(&stack, nullptr));

  // Catch all relevant signals.
  struct sigaction action;
  memset(&action, 0, sizeof(action));

  action.sa_flags = SA_SIGINFO | SA_ONSTACK | SA_NODEFER | SA_RESETHAND;
  action.sa_sigaction = &crashHandler;

  // Dump stack on common "crash" signals.
  KJ_SYSCALL(sigaction(SIGSEGV, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGBUS, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGFPE, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGABRT, &action, nullptr));
  KJ_SYSCALL(sigaction(SIGILL, &action, nullptr));

  // Dump stack on unimplemented syscalls -- useful in seccomp sandboxes.
  KJ_SYSCALL(sigaction(SIGSYS, &action, nullptr));

#ifdef KJ_DEBUG
  // Dump stack on keyboard interrupt -- useful for infinite loops. Only in debug mode, though,
  // because stack traces on ctrl+c can be obnoxious for, say, command-line tools.
  KJ_SYSCALL(sigaction(SIGINT, &action, nullptr));
#endif
}